

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void __thiscall clip_model_loader::load_hparams(clip_model_loader *this)

{
  projector_type pVar1;
  clip_ctx *pcVar2;
  clip_ctx *pcVar3;
  pointer piVar4;
  __type_conflict1 _Var5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  _Base_ptr p_Var10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  runtime_error *this_00;
  char *pcVar14;
  int i;
  long lVar15;
  _Rb_tree_color _Var16;
  int *layer;
  pointer __v;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  allocator<char> local_79;
  string proj_type;
  vector<int,_std::allocator<int>_> vision_feature_layer;
  
  pcVar2 = this->ctx_clip;
  proj_type._M_dataplus._M_p = (pointer)&proj_type.field_2;
  proj_type._M_string_length = 0;
  proj_type.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vision_feature_layer,"clip.projector_type",&local_79);
  get_string(this,(string *)&vision_feature_layer,&proj_type,false);
  std::__cxx11::string::~string((string *)&vision_feature_layer);
  if (proj_type._M_string_length == 0) {
    _Var16 = this->ctx_clip->proj_type;
  }
  else {
    _Var16 = 10;
    for (p_Var10 = PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var10 !=
        &PROJECTOR_TYPE_NAMES_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var10[1]._M_parent,&proj_type);
      if (_Var5) {
        _Var16 = p_Var10[1]._M_color;
        break;
      }
    }
    this->ctx_clip->proj_type = _Var16;
  }
  if (_Var16 == 10) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              ((string *)&vision_feature_layer,"%s: unknown projector type: %s\n","load_hparams",
               proj_type._M_dataplus._M_p);
    std::runtime_error::runtime_error(this_00,(string *)&vision_feature_layer);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string((string *)&proj_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proj_type,"clip.has_text_encoder",(allocator<char> *)&vision_feature_layer);
  get_bool(this,&proj_type,&this->ctx_clip->has_text_encoder,false);
  std::__cxx11::string::~string((string *)&proj_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proj_type,"clip.has_vision_encoder",(allocator<char> *)&vision_feature_layer
            );
  get_bool(this,&proj_type,&this->ctx_clip->has_vision_encoder,false);
  std::__cxx11::string::~string((string *)&proj_type);
  if (this->ctx_clip->has_vision_encoder == false) {
    pcVar14 = "ctx_clip.has_vision_encoder";
    uVar13 = 0x59d;
  }
  else if (this->ctx_clip->has_text_encoder == true) {
    pcVar14 = "!ctx_clip.has_text_encoder";
    uVar13 = 0x59e;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.has_llava_projector",
               (allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->has_llava_projector,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.has_minicpmv_projector",
               (allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->has_minicpmv_projector,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.minicpmv_version",(allocator<char> *)&vision_feature_layer
              );
    get_i32(this,&proj_type,&this->ctx_clip->minicpmv_version,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.has_glm_projector",
               (allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->has_glm_projector,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.has_qwen2vl_merger",
               (allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->has_qwen2vl_merger,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.use_gelu",(allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->use_gelu,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.use_silu",(allocator<char> *)&vision_feature_layer);
    get_bool(this,&proj_type,&this->ctx_clip->use_silu,false);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.embedding_length","vision");
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.hidden_size,true);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.attention.head_count","vision");
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.n_head,true);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.feed_forward_length","vision");
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.n_intermediate,true);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.block_count","vision");
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.n_layer,true);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.projection_dim","vision");
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.projection_dim,true);
    std::__cxx11::string::~string((string *)&proj_type);
    string_format_abi_cxx11_(&proj_type,"clip.%s.attention.layer_norm_epsilon","vision");
    get_f32(this,&proj_type,&(pcVar2->vision_model).hparams.eps,true);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.vision.image_size",
               (allocator<char> *)&vision_feature_layer);
    get_u32(this,&proj_type,(int *)&pcVar2->vision_model,true);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.vision.patch_size",
               (allocator<char> *)&vision_feature_layer);
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.patch_size,true);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.vision.image_crop_resolution",
               (allocator<char> *)&vision_feature_layer);
    get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.image_crop_resolution,false);
    std::__cxx11::string::~string((string *)&proj_type);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proj_type,"clip.vision.image_grid_pinpoints",
               (allocator<char> *)&vision_feature_layer);
    get_arr_int(this,&proj_type,&(pcVar2->vision_model).hparams.image_grid_pinpoints,false);
    std::__cxx11::string::~string((string *)&proj_type);
    proj_type._M_string_length = 0;
    proj_type.field_2._M_local_buf[0] = '\0';
    proj_type._M_dataplus._M_p = (pointer)&proj_type.field_2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vision_feature_layer,"clip.vision.mm_patch_merge_type",&local_79);
    get_string(this,(string *)&vision_feature_layer,&proj_type,false);
    std::__cxx11::string::~string((string *)&vision_feature_layer);
    bVar6 = std::operator==(&proj_type,"spatial_unpad");
    if (bVar6) {
      (pcVar2->vision_model).hparams.mm_patch_merge_type = PATCH_MERGE_SPATIAL_UNPAD;
    }
    std::__cxx11::string::~string((string *)&proj_type);
    uVar7 = gguf_find_key((this->ctx_gguf)._M_t.
                          super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                          super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                          "clip.vision.image_mean");
    uVar8 = gguf_find_key((this->ctx_gguf)._M_t.
                          super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                          super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                          "clip.vision.image_std");
    if ((int)uVar7 < 0) {
      pcVar14 = "idx_mean >= 0 && \"image_mean not found\"";
      uVar13 = 0x5c1;
    }
    else {
      if (-1 < (int)uVar8) {
        lVar11 = gguf_get_arr_data((this->ctx_gguf)._M_t.
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                   uVar7 & 0x7fffffff);
        lVar12 = gguf_get_arr_data((this->ctx_gguf)._M_t.
                                   super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t.
                                   super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
                                   super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl,
                                   uVar8 & 0x7fffffff);
        pcVar3 = this->ctx_clip;
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          pcVar3->image_mean[lVar15] = *(float *)(lVar11 + lVar15 * 4);
          pcVar3->image_std[lVar15] = *(float *)(lVar12 + lVar15 * 4);
        }
        vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&proj_type,"clip.vision.feature_layer",&local_79);
        get_arr_int(this,&proj_type,&vision_feature_layer,false);
        std::__cxx11::string::~string((string *)&proj_type);
        piVar4 = vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__v = vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; __v != piVar4; __v = __v + 1) {
          std::__detail::
          _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&(pcVar2->vision_model).hparams.vision_feature_layer,__v);
        }
        pcVar3 = this->ctx_clip;
        iVar9 = get_deepest_feature_layer(pcVar3);
        pcVar3->max_feature_layer = iVar9;
        if ((int)g_logger_state.verbosity_thold < 3) {
          clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: text_encoder:       %d\n","load_hparams");
          if ((int)g_logger_state.verbosity_thold < 3) {
            clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: vision_encoder:     %d\n","load_hparams");
            if ((int)g_logger_state.verbosity_thold < 3) {
              clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: llava_projector:    %d\n","load_hparams");
              if ((int)g_logger_state.verbosity_thold < 3) {
                clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_projector: %d\n","load_hparams")
                ;
                if ((int)g_logger_state.verbosity_thold < 3) {
                  clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: minicpmv_version:   %d\n",
                                    "load_hparams");
                  if ((int)g_logger_state.verbosity_thold < 3) {
                    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: glm_projector:      %d\n",
                                      "load_hparams");
                    if ((int)g_logger_state.verbosity_thold < 3) {
                      auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)this->model_size);
                      auVar17._8_4_ = (int)(this->model_size >> 0x20);
                      auVar17._12_4_ = 0x45300000;
                      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: model size:         %.2f MiB\n",
                                        SUB84(((auVar17._8_8_ - 1.9342813113834067e+25) +
                                              (auVar17._0_8_ - 4503599627370496.0)) * 0.0009765625 *
                                              0.0009765625,0),"load_hparams");
                      if ((int)g_logger_state.verbosity_thold < 3) {
                        uVar13 = ggml_get_mem_size((this->ctx_meta)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>
                                                  .super__Head_base<0UL,_ggml_context_*,_false>.
                                                  _M_head_impl);
                        auVar18._8_4_ = (int)((ulong)uVar13 >> 0x20);
                        auVar18._0_8_ = uVar13;
                        auVar18._12_4_ = 0x45300000;
                        clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: metadata size:      %.2f MiB\n",
                                          SUB84(((auVar18._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)uVar13) -
                                                4503599627370496.0)) * 0.0009765625 * 0.0009765625,0
                                               ),"load_hparams");
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&vision_feature_layer.super__Vector_base<int,_std::allocator<int>_>);
        pVar1 = this->ctx_clip->proj_type;
        if (pVar1 == PROJECTOR_TYPE_IDEFICS3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&proj_type,"clip.vision.projector.scale_factor",
                     (allocator<char> *)&vision_feature_layer);
          get_u32(this,&proj_type,&(pcVar2->vision_model).hparams.proj_scale_factor,false);
          std::__cxx11::string::~string((string *)&proj_type);
        }
        else if (pVar1 == PROJECTOR_TYPE_PIXTRAL) {
          (pcVar2->vision_model).hparams.rope_theta = 10000.0;
        }
        return;
      }
      pcVar14 = "idx_std >= 0 && \"image_std not found\"";
      uVar13 = 0x5c2;
    }
  }
  uVar13 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                      ,uVar13,"GGML_ASSERT(%s) failed",pcVar14);
  std::__cxx11::string::~string((string *)&proj_type);
  _Unwind_Resume(uVar13);
}

Assistant:

void load_hparams() {
        auto & hparams = ctx_clip.vision_model.hparams;

        // projector type
        {
            std::string proj_type;
            get_string(KEY_PROJ_TYPE, proj_type, false);
            if (!proj_type.empty()) {
                ctx_clip.proj_type = clip_projector_type_from_string(proj_type);
            }
            if (ctx_clip.proj_type == PROJECTOR_TYPE_UNKNOWN) {
                throw std::runtime_error(string_format("%s: unknown projector type: %s\n", __func__, proj_type.c_str()));
            }
        }

        // other hparams
        {
            get_bool(KEY_HAS_TEXT_ENC, ctx_clip.has_text_encoder, false);
            get_bool(KEY_HAS_VIS_ENC, ctx_clip.has_vision_encoder, false);
            GGML_ASSERT(ctx_clip.has_vision_encoder);
            GGML_ASSERT(!ctx_clip.has_text_encoder);

            // legacy keys, use KEY_PROJ_TYPE instead
            get_bool(KEY_HAS_LLAVA_PROJ, ctx_clip.has_llava_projector, false);
            get_bool(KEY_HAS_MINICPMV_PROJ, ctx_clip.has_minicpmv_projector, false);
            get_i32(KEY_MINICPMV_VERSION, ctx_clip.minicpmv_version, false);
            get_bool(KEY_HAS_GLM_PROJ, ctx_clip.has_glm_projector, false);
            get_bool(KEY_HAS_QWEN2VL_MERGER, ctx_clip.has_qwen2vl_merger, false);
            // !!! do NOT extend the list above, use KEY_PROJ_TYPE instead

            get_bool(KEY_USE_GELU, ctx_clip.use_gelu, false);
            get_bool(KEY_USE_SILU, ctx_clip.use_silu, false);

            get_u32(string_format(KEY_N_EMBD,         "vision"), hparams.hidden_size);
            get_u32(string_format(KEY_N_HEAD,         "vision"), hparams.n_head);
            get_u32(string_format(KEY_N_FF,           "vision"), hparams.n_intermediate);
            get_u32(string_format(KEY_N_BLOCK,        "vision"), hparams.n_layer);
            get_u32(string_format(KEY_PROJ_DIM,       "vision"), hparams.projection_dim);
            get_f32(string_format(KEY_LAYER_NORM_EPS, "vision"), hparams.eps);
            get_u32(KEY_IMAGE_SIZE, hparams.image_size);
            get_u32(KEY_PATCH_SIZE, hparams.patch_size);
            get_u32(KEY_IMAGE_CROP_RESOLUTION, hparams.image_crop_resolution, false);
            get_arr_int(KEY_IMAGE_GRID_PINPOINTS, hparams.image_grid_pinpoints, false);

            {
                std::string mm_patch_merge_type;
                get_string(KEY_MM_PATCH_MERGE_TYPE, mm_patch_merge_type, false);
                if (mm_patch_merge_type == "spatial_unpad") {
                    hparams.mm_patch_merge_type = PATCH_MERGE_SPATIAL_UNPAD;
                }
            }

            {
                int idx_mean = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_MEAN);
                int idx_std  = gguf_find_key(ctx_gguf.get(), KEY_IMAGE_STD);
                GGML_ASSERT(idx_mean >= 0 && "image_mean not found");
                GGML_ASSERT(idx_std >= 0  && "image_std not found");
                const float * mean_data = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_mean);
                const float * std_data  = (const float *) gguf_get_arr_data(ctx_gguf.get(), idx_std);
                for (int i = 0; i < 3; ++i) {
                    ctx_clip.image_mean[i] = mean_data[i];
                    ctx_clip.image_std[i]  = std_data[i];
                }
            }

            // Load the vision feature layer indices if they are explicitly provided;
            // if multiple vision feature layers are present, the values will be concatenated
            // to form the final visual features.
            // NOTE: gguf conversions should standardize the values of the vision feature layer to
            // be non-negative, since we use -1 to mark values as unset here.
            std::vector<int> vision_feature_layer;
            get_arr_int(KEY_FEATURE_LAYER, vision_feature_layer, false);
            // convert std::vector to std::unordered_set
            for (auto & layer : vision_feature_layer) {
                hparams.vision_feature_layer.insert(layer);
            }
            // Calculate the deepest feature layer based on hparams and projector type
            ctx_clip.max_feature_layer = get_deepest_feature_layer(&ctx_clip);

            LOG_INF("%s: text_encoder:       %d\n", __func__, ctx_clip.has_text_encoder);
            LOG_INF("%s: vision_encoder:     %d\n", __func__, ctx_clip.has_vision_encoder);
            LOG_INF("%s: llava_projector:    %d\n", __func__, ctx_clip.has_llava_projector);
            LOG_INF("%s: minicpmv_projector: %d\n", __func__, ctx_clip.has_minicpmv_projector);
            LOG_INF("%s: minicpmv_version:   %d\n", __func__, ctx_clip.minicpmv_version);
            LOG_INF("%s: glm_projector:      %d\n", __func__, ctx_clip.has_glm_projector);
            LOG_INF("%s: model size:         %.2f MiB\n", __func__, model_size / 1024.0 / 1024.0);
            LOG_INF("%s: metadata size:      %.2f MiB\n", __func__, ggml_get_mem_size(ctx_meta.get()) / 1024.0 / 1024.0);
        }

        // model-specific params
        switch (ctx_clip.proj_type) {
            case PROJECTOR_TYPE_IDEFICS3:
                {
                    get_u32(KEY_PROJ_SCALE_FACTOR, hparams.proj_scale_factor, false);
                } break;
            case PROJECTOR_TYPE_PIXTRAL:
                {
                    hparams.rope_theta = 10000.0f;
                } break;
            default:
                break;
        }
    }